

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O3

bool __thiscall SGParser::Generator::Lex::MakeDFAUsingNFA(Lex *this,DFAGen *dfa)

{
  uint uVar1;
  pointer pbVar2;
  size_t sVar3;
  pointer ppNVar4;
  bool bVar5;
  uint uVar6;
  iterator iVar7;
  NFA *pNVar8;
  mapped_type *ppNVar9;
  long lVar10;
  pointer pEVar11;
  _Base_ptr p_Var12;
  ulong uVar13;
  pointer __k;
  undefined1 auVar14 [8];
  ulong uVar15;
  undefined1 auStack_168 [8];
  DFAGen dfa2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
  macroNFAs;
  NFA combinedNFA;
  undefined1 auStack_48 [8];
  vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_> lexemeNFAList;
  
  macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&macroNFAs;
  macroNFAs._M_t._M_impl._0_4_ = 0;
  macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  __k = (this->MacroNames).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (this->MacroNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if ((long)pbVar2 - (long)__k >> 5 !=
      (this->Macros)._M_t._M_impl.super__Rb_tree_header._M_node_count) {
    __assert_fail("MacroNames.size() == Macros.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                  ,0x41e,"bool SGParser::Generator::Lex::MakeDFAUsingNFA(DFAGen &)");
  }
  if (__k != pbVar2) {
    do {
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)this,__k);
      if ((_Rb_tree_header *)iVar7._M_node == &(this->Macros)._M_t._M_impl.super__Rb_tree_header) {
        __assert_fail("iter != Macros.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                      ,0x421,"bool SGParser::Generator::Lex::MakeDFAUsingNFA(DFAGen &)");
      }
      pNVar8 = (NFA *)operator_new(0x28);
      pNVar8->LexemeId = 0xffffffff;
      pNVar8->pStartState = (NFANode *)0x0;
      (pNVar8->FinalState).
      super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pNVar8->FinalState).
      super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (pNVar8->FinalState).
      super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar5 = MakeNFA(this,pNVar8,(String *)(iVar7._M_node + 2),
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                       *)&dfa2.EmptyStateCount);
      if (bVar5) {
        ppNVar9 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                                *)&dfa2.EmptyStateCount,__k);
        *ppNVar9 = pNVar8;
      }
      else {
        NFA::~NFA(pNVar8);
        operator_delete(pNVar8,0x28);
      }
      __k = __k + 1;
    } while (__k != pbVar2);
  }
  lVar10 = (long)(this->Lexemes).
                 super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->Lexemes).
                 super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if ((lVar10 != 0) &&
     ((this->Expressions).
      super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (this->Expressions).
      super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    auStack_168 = (undefined1  [8])((ulong)(uint)((int)(lVar10 >> 3) * -0x3b13b13b) << 0x20);
    std::
    vector<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
    ::emplace_back<SGParser::Generator::Lex::Expression>
              (&this->Expressions,(Expression *)auStack_168);
  }
  auStack_48 = (undefined1  [8])0x0;
  lexemeNFAList.
  super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  lexemeNFAList.
  super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dfa2.super_DFA.CharTable._0_8_ =
       &dfa2.super_DFA.CharTable.values._M_h._M_rehash_policy._M_next_resize;
  dfa2.super_DFA.ExpressionStartStates.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dfa2.super_DFA.ExpressionStartStates.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dfa2.super_DFA.LexemeInfos.
  super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dfa2.super_DFA.LexemeInfos.
  super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dfa2.super_DFA.AcceptStates.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dfa2.super_DFA.LexemeInfos.
  super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dfa2.super_DFA.AcceptStates.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dfa2.super_DFA.AcceptStates.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dfa2.super_DFA.TransitionTable.
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dfa2.super_DFA.TransitionTable.
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  auStack_168._0_4_ = 0;
  auStack_168._4_4_ = 0;
  dfa2.super_DFA.TransitionTable.
  super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dfa2.super_DFA.ExpressionStartStates.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._0_4_ = 0xffffffff;
  dfa2.super_DFA.CharTable.values._M_h._M_buckets = (__buckets_ptr)0x1;
  dfa2.super_DFA.CharTable.values._M_h._M_bucket_count = 0;
  dfa2.super_DFA.CharTable.values._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  dfa2.super_DFA.CharTable.values._M_h._M_element_count._0_4_ = 0x3f800000;
  dfa2.super_DFA.CharTable.values._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  dfa2.super_DFA.CharTable.values._M_h._M_rehash_policy._4_4_ = 0;
  dfa2.super_DFA.CharTable.values._M_h._M_rehash_policy._M_next_resize = 0;
  dfa2.super_DFA.CharTable.values._M_h._M_single_bucket._0_4_ = 0xff;
  dfa2.Messages.Flags = 0;
  dfa2.Messages._4_4_ = 0;
  dfa2.Messages.pMessages = (Messages *)0x0;
  pEVar11 = (this->Expressions).
            super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->Expressions).
      super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
      ._M_impl.super__Vector_impl_data._M_finish != pEVar11) {
    uVar13 = 0;
    do {
      uVar1 = pEVar11[uVar13].StartLexeme;
      uVar15 = (ulong)uVar1;
      uVar6 = pEVar11[uVar13].LexemeCount + uVar1;
      if (uVar1 < uVar6) {
        lVar10 = uVar15 * 0x68 + 0x20;
LAB_0013dec4:
        macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)operator_new(0x28);
        ((NFA *)macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count)->LexemeId =
             (int)uVar15 + 2;
        ((NFA *)macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count)->pStartState =
             (NFANode *)0x0;
        (((NFA *)macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count)->FinalState).
        super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (((NFA *)macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count)->FinalState).
        super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (((NFA *)macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count)->FinalState).
        super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        bVar5 = MakeNFA(this,(NFA *)macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                        (String *)
                        ((long)&(((this->Lexemes).
                                  super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->Name)._M_dataplus._M_p
                        + lVar10),
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                         *)&dfa2.EmptyStateCount);
        if (bVar5) goto code_r0x0013df04;
        CheckForErrorAndReport
                  (this,"Failed to make an NFA from the \'%s\' expression.",
                   *(undefined8 *)
                    ((long)&(((this->Lexemes).
                              super__Vector_base<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>
                              ._M_impl.super__Vector_impl_data._M_start)->Name)._M_dataplus._M_p +
                    lVar10));
        sVar3 = macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count;
        if (macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
          NFA::~NFA((NFA *)macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count);
        }
        operator_delete((void *)sVar3,0x28);
        ppNVar4 = lexemeNFAList.
                  super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        for (auVar14 = auStack_48; auVar14 != (undefined1  [8])ppNVar4;
            auVar14 = (undefined1  [8])((long)auVar14 + 8)) {
          pNVar8 = *(NFA **)auVar14;
          if (pNVar8 != (NFA *)0x0) {
            NFA::~NFA(pNVar8);
          }
          operator_delete(pNVar8,0x28);
        }
        goto LAB_0013e0d5;
      }
LAB_0013df35:
      macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count =
           CONCAT44(macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_,1);
      NFA::CombineNFAs((NFA *)&macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                        *)auStack_48);
      ppNVar4 = lexemeNFAList.
                super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      auVar14 = auStack_48;
      if (auStack_48 !=
          (undefined1  [8])
          lexemeNFAList.
          super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        do {
          pNVar8 = *(NFA **)auVar14;
          if (pNVar8 != (NFA *)0x0) {
            NFA::~NFA(pNVar8);
          }
          operator_delete(pNVar8,0x28);
          auVar14 = (undefined1  [8])((long)auVar14 + 8);
        } while (auVar14 != (undefined1  [8])ppNVar4);
        if ((undefined1  [8])
            lexemeNFAList.
            super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
            ._M_impl.super__Vector_impl_data._M_start != auStack_48) {
          lexemeNFAList.
          super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)auStack_48;
        }
      }
      if (uVar13 == 0) {
        DFAGen::Create(dfa,(NFA *)&macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       &this->Lexemes,0x100);
      }
      else {
        DFAGen::Create((DFAGen *)auStack_168,
                       (NFA *)&macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       &this->Lexemes,
                       (int)(dfa->super_DFA).CharTable.values._M_h._M_element_count - 1);
        bVar5 = DFAGen::Combine(dfa,(DFAGen *)auStack_168);
        if (!bVar5) {
          CheckForErrorAndReport(this,"Failed to combine DFAs.");
          NFA::~NFA((NFA *)&macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count);
LAB_0013e0d5:
          bVar5 = false;
          goto LAB_0013e0d7;
        }
      }
      NFA::~NFA((NFA *)&macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count);
      uVar13 = uVar13 + 1;
      pEVar11 = (this->Expressions).
                super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(this->Expressions).
                                    super__Vector_base<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar11 >> 3)
            );
  }
  bVar5 = true;
  for (p_Var12 = macroNFAs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var12 != (_Rb_tree_node_base *)&macroNFAs;
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12)) {
    pNVar8 = *(NFA **)(p_Var12 + 2);
    if (pNVar8 != (NFA *)0x0) {
      NFA::~NFA(pNVar8);
    }
    operator_delete(pNVar8,0x28);
  }
LAB_0013e0d7:
  std::
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_unsigned_int>,_std::allocator<std::pair<const_unsigned_long,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&dfa2.super_DFA.CharTable);
  if (dfa2.super_DFA.LexemeInfos.
      super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(dfa2.super_DFA.LexemeInfos.
                    super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)dfa2.super_DFA.ExpressionStartStates.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)dfa2.super_DFA.LexemeInfos.
                          super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (dfa2.super_DFA.AcceptStates.
      super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(dfa2.super_DFA.AcceptStates.
                    super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)dfa2.super_DFA.LexemeInfos.
                          super__Vector_base<SGParser::LexemeInfo,_std::allocator<SGParser::LexemeInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)dfa2.super_DFA.AcceptStates.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (dfa2.super_DFA.TransitionTable.
      super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(dfa2.super_DFA.TransitionTable.
                    super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (long)dfa2.super_DFA.AcceptStates.
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)dfa2.super_DFA.TransitionTable.
                          super__Vector_base<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
  ::~vector((vector<std::vector<unsigned_short,_std::allocator<unsigned_short>_>,_std::allocator<std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>_>
             *)auStack_168);
  if (auStack_48 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_48,
                    (long)lexemeNFAList.
                          super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)auStack_48);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
               *)&dfa2.EmptyStateCount);
  return bVar5;
code_r0x0013df04:
  if (lexemeNFAList.
      super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      lexemeNFAList.
      super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<SGParser::Generator::NFA*,std::allocator<SGParser::Generator::NFA*>>::
    _M_realloc_insert<SGParser::Generator::NFA*const&>
              ((vector<SGParser::Generator::NFA*,std::allocator<SGParser::Generator::NFA*>> *)
               auStack_48,
               (iterator)
               lexemeNFAList.
               super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
               ._M_impl.super__Vector_impl_data._M_start,
               (NFA **)&macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  }
  else {
    *lexemeNFAList.
     super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>.
     _M_impl.super__Vector_impl_data._M_start =
         (NFA *)macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count;
    lexemeNFAList.
    super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>.
    _M_impl.super__Vector_impl_data._M_start =
         lexemeNFAList.
         super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
         ._M_impl.super__Vector_impl_data._M_start + 1;
  }
  uVar15 = uVar15 + 1;
  lVar10 = lVar10 + 0x68;
  if (uVar6 == uVar15) goto LAB_0013df35;
  goto LAB_0013dec4;
}

Assistant:

bool Lex::MakeDFAUsingNFA(DFAGen& dfa) {
    // Store the macro NFAs
    std::map<String, NFA*> macroNFAs;

    // Go through all macros (in declaration-order) and create NFA's for them.
    // ("In declaration-order" so a lexically-later macro can refer to a lexically-earlier macro.)
    SG_ASSERT(MacroNames.size() == Macros.size());
    for (const String& name : MacroNames) {
        auto const iter = Macros.find(name);
        SG_ASSERT(iter != Macros.end());
        auto const& regExp = iter->second;

        // Create a new nfa to be filled
        const auto pnfa = new NFA;

        // if the nfa failed to initialize then quite
        if (MakeNFA(*pnfa, regExp, macroNFAs))
            macroNFAs[name] = pnfa;
        else
            delete pnfa; // Should we report an error?
    }

    // If there are lexemes, but not a single expression
    // make an expression for them (special case)
    if (Lexemes.size() && !Expressions.size())
        Expressions.push_back({0u, unsigned(Lexemes.size())});

    // Go through all expression lexemes and construct a list of DFA
    std::vector<NFA*> lexemeNFAList;
    DFAGen            dfa2;

    for (size_t i = 0u; i < Expressions.size(); ++i) {
        // Store NFAs for this expression
        const auto EndLexeme = Expressions[i].StartLexeme + Expressions[i].LexemeCount;
        for (unsigned j = Expressions[i].StartLexeme; j < EndLexeme; ++j) {
            const auto pnfa = new NFA{j + TokenCode::TokenFirstID};

            // if the nfa failed to initialize then quit
            if (!MakeNFA(*pnfa, Lexemes[j].RegularExpression, macroNFAs)) {
                // ERROR: Making an NFA from RE failed, probably syntax error in RE
                CheckForErrorAndReport("Failed to make an NFA from the '%s' expression.",
                                       Lexemes[j].RegularExpression.data());

                // This seems to be necessary here in case of error
                delete pnfa;
                for (const auto nfa : lexemeNFAList)
                    delete nfa;

                return false;
            }

            lexemeNFAList.push_back(pnfa);
        }

        // Combine all the individual NFAs into one
        NFA combinedNFA{1u};
        combinedNFA.CombineNFAs(lexemeNFAList);

        for (const auto nfa: lexemeNFAList)
            delete nfa;
        lexemeNFAList.clear();

        // Make a DFA from the huge NFA
        // Should really have a more complex character-counting scheme!
        if (i == 0u)
            dfa.Create(combinedNFA, Lexemes, 256u);
        else {
            // And combine it to form an expression
            dfa2.Create(combinedNFA, Lexemes, unsigned(dfa.GetCharCount() - 1u));
            if (!dfa.Combine(dfa2)) {
                // ERROR: Failed to combine DFAs, probably inconsistent states
                CheckForErrorAndReport("Failed to combine DFAs.");
                return false;
            }
        }
    }

    // Free all the macro NFA's
    for (const auto& [_, nfa] : macroNFAs)
        delete nfa;

    return true;
}